

Human: Reconstruct the original C/C++ source from this Ghidra decompilation:

# wasm-builder.h
# Opt level: O1

RefFunc * __thiscall wasm::Builder::makeRefFunc(Builder *this,Name func,HeapType heapType)

{
  Type TVar1;
  Type local_30;
  
  TVar1.id = (uintptr_t)MixedArena::allocSpace((MixedArena *)(this->wasm + 0x158),0x20,8);
  *(undefined4 *)TVar1.id = 0x2b;
  *(undefined8 *)(TVar1.id + 8) = 0;
  *(undefined8 *)(TVar1.id + 0x10) = 0;
  *(size_t *)(TVar1.id + 0x10) = func.super_IString.str._M_len;
  *(char **)(TVar1.id + 0x18) = func.super_IString.str._M_str;
  wasm::Type::Type(&local_30,heapType,NonNullable);
  wasm::RefFunc::finalize(TVar1);
  return (RefFunc *)TVar1.id;
}

Assistant:

RefFunc* makeRefFunc(Name func, HeapType heapType) {
    auto* ret = wasm.allocator.alloc<RefFunc>();
    ret->func = func;
    ret->finalize(Type(heapType, NonNullable));
    return ret;
  }